

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::
add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
::clean(add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
        *this)

{
  add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>
  *in_RDI;
  relu_ *unaff_retaddr;
  
  resizable_tensor::clear((resizable_tensor *)in_RDI);
  resizable_tensor::clear((resizable_tensor *)in_RDI);
  resizable_tensor::clear((resizable_tensor *)in_RDI);
  resizable_tensor::clear((resizable_tensor *)in_RDI);
  *(undefined1 *)((long)&(in_RDI->details).empty_params.super_tensor.m_k + 1) = 1;
  std::
  unique_ptr<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
  ::operator->((unique_ptr<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                *)0x1b23ba);
  add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::affine>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>
  ::clean(in_RDI);
  call_clean_method_if_exists<dlib::relu_>(unaff_retaddr);
  return;
}

Assistant:

void clean()
        {
            x_grad.clear();
            cached_output.clear();
            params_grad.clear();
            temp_tensor.clear();
            gradient_input_is_stale = true;
            subnetwork->clean();
            call_clean_method_if_exists(details);
        }